

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall
powerpc_test_cpu::print_flags(powerpc_test_cpu *this,uint32_t cr,uint32_t xer,int crf)

{
  uint uVar1;
  uint32_t uVar2;
  char *local_a0;
  char *local_88;
  char *local_70;
  char *local_58;
  char *local_40;
  char *local_28;
  int crf_local;
  uint32_t xer_local;
  uint32_t cr_local;
  powerpc_test_cpu *this_local;
  
  uVar1 = cr << ((byte)(crf << 2) & 0x1f);
  uVar2 = bit_field<0,_0>::mask();
  if ((uVar1 & uVar2) == 0) {
    local_28 = "__";
  }
  else {
    local_28 = "LT";
  }
  uVar2 = bit_field<1,_1>::mask();
  if ((uVar1 & uVar2) == 0) {
    local_40 = "__";
  }
  else {
    local_40 = "GT";
  }
  uVar2 = bit_field<2,_2>::mask();
  if ((uVar1 & uVar2) == 0) {
    local_58 = "__";
  }
  else {
    local_58 = "EQ";
  }
  uVar2 = bit_field<3,_3>::mask();
  if ((uVar1 & uVar2) == 0) {
    local_70 = "__";
  }
  else {
    local_70 = "SO";
  }
  uVar2 = bit_field<1,_1>::mask();
  if ((xer & uVar2) == 0) {
    local_88 = "__";
  }
  else {
    local_88 = "OV";
  }
  uVar2 = bit_field<2,_2>::mask();
  if ((xer & uVar2) == 0) {
    local_a0 = "__";
  }
  else {
    local_a0 = "CA";
  }
  printf("%s,%s,%s,%s,%s,%s",local_28,local_40,local_58,local_70,local_88,local_a0);
  return;
}

Assistant:

void powerpc_test_cpu::print_flags(uint32_t cr, uint32_t xer, int crf) const
{
	cr = cr << (4 * crf);
	printf("%s,%s,%s,%s,%s,%s",
		   (cr & CR_LT_field<0>::mask() ? "LT" : "__"),
		   (cr & CR_GT_field<0>::mask() ? "GT" : "__"),
		   (cr & CR_EQ_field<0>::mask() ? "EQ" : "__"),
		   (cr & CR_SO_field<0>::mask() ? "SO" : "__"),
		   (xer & XER_OV_field::mask()  ? "OV" : "__"),
		   (xer & XER_CA_field::mask()  ? "CA" : "__"));
}